

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

int xmlParserInputBufferRead(xmlParserInputBufferPtr in,int len)

{
  int iVar1;
  int len_local;
  xmlParserInputBufferPtr in_local;
  
  if ((in == (xmlParserInputBufferPtr)0x0) || (in->error != 0)) {
    in_local._4_4_ = -1;
  }
  else if (in->readcallback == (xmlInputReadCallback)0x0) {
    iVar1 = xmlBufGetAllocationScheme(in->buffer);
    if (iVar1 == 2) {
      in_local._4_4_ = 0;
    }
    else {
      in_local._4_4_ = -1;
    }
  }
  else {
    in_local._4_4_ = xmlParserInputBufferGrow(in,len);
  }
  return in_local._4_4_;
}

Assistant:

int
xmlParserInputBufferRead(xmlParserInputBufferPtr in, int len) {
    if ((in == NULL) || (in->error)) return(-1);
    if (in->readcallback != NULL)
	return(xmlParserInputBufferGrow(in, len));
    else if (xmlBufGetAllocationScheme(in->buffer) == XML_BUFFER_ALLOC_IMMUTABLE)
	return(0);
    else
        return(-1);
}